

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

float32 float32_mul_x86_64(float32 a,float32 b,float_status *s)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  ulong uVar5;
  union_float32 ub;
  uint uVar6;
  union_float32 ua;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  float fVar16;
  FloatParts FVar17;
  FloatParts FVar18;
  FloatParts p;
  
  uVar2 = (ulong)a;
  uVar1 = (ulong)b;
  bVar4 = s->float_exception_flags;
  if (((bVar4 & 0x20) != 0) && (s->float_rounding_mode == '\0')) {
    if (s->flush_inputs_to_zero != '\0') {
      bVar15 = (a & 0x7f800000) == 0;
      bVar12 = (a & 0x7fffffff) != 0;
      if (bVar12 && bVar15) {
        uVar2 = (ulong)(a & 0x80000000);
        bVar4 = bVar4 | 0x40;
      }
      bVar13 = (b & 0x7f800000) == 0;
      bVar14 = (b & 0x7fffffff) != 0;
      if (bVar14 && bVar13) {
        uVar1 = (ulong)(b & 0x80000000);
        bVar4 = bVar4 | 0x40;
      }
      if (bVar12 && bVar15 || bVar14 && bVar13) {
        s->float_exception_flags = bVar4;
      }
    }
    b = (float32)uVar1;
    if ((((uVar2 & 0x7fffffff) == 0) || (((int)(uVar2 >> 0x17) + 1U & 0xfe) != 0)) &&
       (((uVar1 & 0x7fffffff) == 0 || (((int)(uVar1 >> 0x17) + 1U & 0xfe) != 0)))) {
      if ((uVar2 & 0x7fffffff) == 0 || (uVar1 & 0x7fffffff) == 0) {
        return (b ^ (uint)(float)uVar2) & 0x80000000;
      }
      fVar16 = (float)b * (float)uVar2;
      if (ABS(fVar16) == INFINITY) {
        s->float_exception_flags = bVar4 | 8;
        return (float32)fVar16;
      }
      if (1.1754944e-38 < ABS(fVar16)) {
        return (float32)fVar16;
      }
    }
  }
  FVar17._8_8_ = (ulong)((uint)(uVar2 >> 0x17) & 0xff) | (ulong)((uint)uVar2 & 0x80000000) << 9;
  FVar17.frac = (ulong)((uint)uVar2 & 0x7fffff);
  FVar17 = sf_canonicalize(FVar17,&float32_params,s);
  uVar11 = FVar17._8_8_;
  uVar1 = FVar17.frac;
  FVar18._8_8_ = (ulong)(b >> 0x17 & 0xff) | (ulong)(b & 0x80000000) << 9;
  FVar18.frac = (ulong)(b & 0x7fffff);
  FVar18 = sf_canonicalize(FVar18,&float32_params,s);
  uVar3 = FVar18._8_8_;
  uVar2 = FVar18.frac;
  uVar5 = (uVar3 ^ uVar11) & 0x10000000000;
  uVar7 = FVar17._12_4_ & 0xff;
  uVar6 = FVar18._12_4_ & 0xff;
  if ((uVar7 == 2) && (uVar6 == 2)) {
    uVar8 = (uVar1 & 0xffffffff) * (uVar2 >> 0x20);
    uVar9 = (ulong)(uint)FVar18.frac * (uVar1 >> 0x20);
    uVar10 = uVar9 + uVar8;
    uVar3 = uVar2 * uVar1;
    uVar2 = ((uVar10 >> 0x20) + (uVar2 >> 0x20) * (uVar1 >> 0x20) +
             ((ulong)CARRY8(uVar9,uVar8) << 0x20) + (ulong)(uVar3 < uVar10 << 0x20)) * 4;
    uVar8 = uVar2 | uVar3 >> 0x3e;
    bVar15 = (uVar3 & 0x3fffffffffffffff) != 0;
    uVar1 = (ulong)((uint)bVar15 | (uint)uVar8 & 1) | uVar8 >> 1;
    if (-1 < (long)uVar8) {
      uVar1 = bVar15 | uVar8;
    }
    uVar11 = uVar11 & 0xffff00ff00000000 |
             (ulong)(uint)((FVar18.exp + FVar17.exp) - (int)((long)uVar2 >> 0x3f));
  }
  else {
    if (((uVar11 | uVar3) & 0xfc00000000) != 0) {
      p = pick_nan(FVar17,FVar18,s);
      goto LAB_004d91c4;
    }
    if (((uVar7 == 3) && (uVar6 == 1)) || ((uVar7 == 1 && (uVar6 == 3)))) {
      s->float_exception_flags = s->float_exception_flags | 1;
      p.exp = 0x7fffffff;
      p.cls = float_class_qnan;
      p.sign = true;
      p._14_2_ = 0;
      p.frac = 0x2000000000000000;
      goto LAB_004d91c4;
    }
    if ((uVar7 | 2) != 3) {
      if ((uVar6 | 2) != 3) {
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                   ,0x4e6,(char *)0x0);
      }
      uVar5 = uVar5 | uVar3 & 0xffff0003ffffffff;
      p.exp = (int)uVar5;
      p.cls = (char)(uVar5 >> 0x20);
      p.sign = (_Bool)(char)(uVar5 >> 0x28);
      p._14_2_ = (short)(uVar5 >> 0x30);
      p.frac = uVar2;
      goto LAB_004d91c4;
    }
    uVar11 = uVar11 & 0xffff0003ffffffff;
  }
  uVar11 = uVar11 | uVar5;
  p.exp = (int)uVar11;
  p.cls = (char)(uVar11 >> 0x20);
  p.sign = (_Bool)(char)(uVar11 >> 0x28);
  p._14_2_ = (short)(uVar11 >> 0x30);
  p.frac = uVar1;
LAB_004d91c4:
  FVar17 = round_canonical(p,s,&float32_params);
  return (uint)FVar17.frac & 0x7fffff | (FVar17.exp & 0xffU) << 0x17 |
         (uint)(FVar17._8_8_ >> 9) & 0x80000000;
}

Assistant:

static inline bool can_use_fpu(const float_status *s)
{
    if (QEMU_NO_HARDFLOAT) {
        return false;
    }
    return likely(s->float_exception_flags & float_flag_inexact &&
                  s->float_rounding_mode == float_round_nearest_even);
}